

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECoordinates.cpp
# Opt level: O0

CECoordinates * __thiscall
CECoordinates::ConvertToICRS
          (CECoordinates *this,double jd,double longitude,double latitude,double elevation_m,
          double pressure_hPa,double temperature_celsius,double relative_humidity,double dut1,
          double xp,double yp,double wavelength_um)

{
  long *in_RSI;
  CECoordinates *in_RDI;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  double in_XMM4_Qa;
  double in_XMM5_Qa;
  double in_XMM7_Qa;
  double *in_stack_00000008;
  CEAngle *in_stack_00000010;
  CECoordinateType *in_stack_00000018;
  double ycoord_new;
  double xcoord_new;
  double *in_stack_fffffffffffffeb8;
  double *in_stack_fffffffffffffec0;
  double *in_stack_fffffffffffffec8;
  CEAngle *in_stack_fffffffffffffed0;
  CECoordinateType *in_stack_fffffffffffffed8;
  CEDate *in_stack_fffffffffffffee0;
  CEAngle *in_stack_fffffffffffffee8;
  CECoordinates *in_stack_fffffffffffffef0;
  undefined1 *input_ra;
  undefined1 local_a0 [8];
  double in_stack_ffffffffffffff68;
  double in_stack_ffffffffffffff70;
  double in_stack_ffffffffffffff78;
  double in_stack_ffffffffffffff80;
  double in_stack_ffffffffffffff88;
  double in_stack_ffffffffffffff90;
  double *in_stack_ffffffffffffff98;
  double *ra;
  double dVar1;
  
  dVar1 = 0.0;
  ra = (double *)0x0;
  if ((int)in_RSI[5] == 0) {
    CppEphem::julian_date_J2000();
    in_stack_fffffffffffffef0 = (CECoordinates *)(**(code **)(*in_RSI + 0x28))();
    CppEphem::julian_date_J2000();
    dVar1 = (double)(**(code **)(*in_RSI + 0x38))();
    input_ra = local_a0;
    CEDate::CEDate(in_stack_fffffffffffffee0,(double)in_stack_fffffffffffffed8,
                   (CEDateType)((ulong)in_stack_fffffffffffffed0 >> 0x20));
    CIRS2ICRS((double)input_ra,dVar1,(double *)in_stack_fffffffffffffef0,
              (double *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
              in_stack_fffffffffffffed8);
    CEDate::~CEDate((CEDate *)0x14e7f0);
  }
  else if ((int)in_RSI[5] == 1) {
    CppEphem::julian_date_J2000();
    (**(code **)(*in_RSI + 0x28))();
    CppEphem::julian_date_J2000();
    (**(code **)(*in_RSI + 0x38))();
  }
  else if ((int)in_RSI[5] == 2) {
    CppEphem::julian_date_J2000();
    in_stack_fffffffffffffee8 = (CEAngle *)(**(code **)(*in_RSI + 0x28))();
    CppEphem::julian_date_J2000();
    (**(code **)(*in_RSI + 0x38))();
    Galactic2ICRS((double)in_stack_fffffffffffffed0,(double)in_stack_fffffffffffffec8,
                  in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,(CEAngleType *)0x14e8bf);
  }
  else if ((int)in_RSI[5] == 3) {
    CppEphem::julian_date_J2000();
    in_stack_fffffffffffffee0 = (CEDate *)(**(code **)(*in_RSI + 0x28))();
    CppEphem::julian_date_J2000();
    (**(code **)(*in_RSI + 0x38))();
    Observed2ICRS(in_XMM7_Qa,dVar1,ra,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                  in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                  in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_XMM5_Qa,in_XMM4_Qa,
                  in_XMM3_Qa,in_XMM2_Qa,in_XMM1_Qa);
    in_stack_fffffffffffffec8 = in_stack_00000008;
    in_stack_fffffffffffffed0 = in_stack_00000010;
    in_stack_fffffffffffffed8 = in_stack_00000018;
  }
  CEAngle::CEAngle(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  CEAngle::CEAngle(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  CECoordinates(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                (CEAngle *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  CEAngle::~CEAngle((CEAngle *)0x14ea00);
  CEAngle::~CEAngle((CEAngle *)0x14ea0d);
  return in_RDI;
}

Assistant:

CECoordinates CECoordinates::ConvertToICRS(double jd,
                            double longitude,
                            double latitude,
                            double elevation_m,
                            double pressure_hPa,
                            double temperature_celsius,
                            double relative_humidity,
                            double dut1,
                            double xp, double yp,
                            double wavelength_um)
{
    double xcoord_new(0.0);
    double ycoord_new(0.0);
    if (coord_type_ == CECoordinateType::CIRS) {
        CIRS2ICRS(XCoordinate_Rad(), YCoordinate_Rad(),
                  &xcoord_new, &ycoord_new, jd, CEAngleType::RADIANS) ;
    } else if (coord_type_ == CECoordinateType::ICRS) {
        xcoord_new = XCoordinate_Rad() ;
        ycoord_new = YCoordinate_Rad() ;
    } else if (coord_type_ == CECoordinateType::GALACTIC) {
        Galactic2ICRS(XCoordinate_Rad(), YCoordinate_Rad(),
                      &xcoord_new, &ycoord_new, CEAngleType::RADIANS) ;
    } else if (coord_type_ == CECoordinateType::OBSERVED) {
        Observed2ICRS(XCoordinate_Rad(), YCoordinate_Rad(),
                      &xcoord_new, &ycoord_new,
                      jd, longitude, latitude,
                      elevation_m, pressure_hPa,
                      temperature_celsius, relative_humidity,
                      dut1, xp, yp, wavelength_um) ;
    }
    
    return CECoordinates(xcoord_new, ycoord_new,
                         CECoordinateType::ICRS) ;
}